

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testlab11.c
# Opt level: O2

int CheckFromArray(void)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  char *pcVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  int cost;
  int weight;
  int knapsackCost;
  
  stream.Out = (FILE *)fopen("out.txt","r");
  if ((FILE *)stream.Out == (FILE *)0x0) {
    puts("can\'t open out.txt");
    currentTest = currentTest + 1;
    iVar3 = -1;
  }
  else {
    knapsackCost = 0;
    pcVar4 = ScanInt(stream.Out,&knapsackCost);
    iVar3 = 1;
    if (pcVar4 == "PASSED") {
      if (knapsackCost == TestData.Tests[currentTest].KnapsackCost) {
        weight = 0;
        cost = 0;
        uVar7 = 0;
        while (iVar3 = __isoc99_fscanf(stream.Out,"%d %d",&weight,&cost), iVar3 == 2) {
          lVar5 = currentTest * 0x478;
          if (TestData.Tests[currentTest].CountResultItems <= uVar7) {
            pcVar4 = "Output too long -- failed";
            goto LAB_001024fd;
          }
          uVar1 = *(uint *)(lVar5 + 0x103368 + uVar7 * 8);
          uVar6 = (ulong)uVar1;
          if (uVar1 != weight) {
            uVar2 = *(uint *)(lVar5 + 0x10336c + uVar7 * 8);
            uVar1 = weight;
LAB_00102510:
            printf("Wrong item output. Found %d %d, but excepted %d %d. -- Failed\n",(ulong)uVar1,
                   (ulong)(uint)cost,uVar6,(ulong)uVar2);
            goto LAB_0010251e;
          }
          uVar2 = *(uint *)(lVar5 + 0x10336c + uVar7 * 8);
          if (uVar2 != cost) goto LAB_00102510;
          uVar7 = uVar7 + 1;
        }
        if (uVar7 < TestData.Tests[currentTest].CountResultItems) {
          pcVar4 = "Output too short -- Failed";
LAB_001024fd:
          puts(pcVar4);
LAB_0010251e:
          iVar3 = 1;
        }
        else {
          puts("PASSED");
          currentTest = currentTest + 1;
          fclose((FILE *)stream.Out);
          iVar3 = 0;
        }
      }
      else {
        printf("Wrong knapsack cost output. Found %d, but excepted %d. -- Failed\n");
      }
    }
  }
  return iVar3;
}

Assistant:

static int CheckFromArray(void) {
    stream.Out = fopen("out.txt", "r");
    if (!stream.Out) {
        printf("can't open out.txt\n");
        currentTest++;
        return -1;
    }
    int knapsackCost = 0;
    const char* result = ScanInt(stream.Out, &knapsackCost);
    if (result != Pass) {
        return 1;
    }
    if (knapsackCost != TestData.Tests[currentTest].KnapsackCost) {
        printf("Wrong knapsack cost output. Found %d, but excepted %d. -- Failed\n", knapsackCost, TestData.Tests[currentTest].KnapsackCost);
        return 1;
    }
    
    int weight = 0, cost = 0;
    size_t readItemsCount = 0;
    while(fscanf(stream.Out, "%d %d", &weight, &cost) == 2) {
        if (readItemsCount >= TestData.Tests[currentTest].CountResultItems) {
            printf("Output too long -- failed\n");
            return 1;
        }
        if (TestData.Tests[currentTest].Result[readItemsCount].Weight != weight || TestData.Tests[currentTest].Result[readItemsCount].Cost != cost) {
            printf("Wrong item output. Found %d %d, but excepted %d %d. -- Failed\n", weight, cost, TestData.Tests[currentTest].Result[readItemsCount].Weight, TestData.Tests[currentTest].Result[readItemsCount].Cost);
            return 1;
        }
        ++readItemsCount;
    }
    if (readItemsCount < TestData.Tests[currentTest].CountResultItems) {
        printf("Output too short -- Failed\n");
        return 1;
    }
    printf("PASSED\n");
    ++currentTest;
    fclose(stream.Out);
    return 0;
}